

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O1

void WaterStep(Gamefield *gamefield,IntVec2 coords)

{
  int iVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  IntVec2 local_28;
  IntVec2 local_20;
  
  uVar5 = coords.x;
  local_20.y = coords.y;
  iVar1 = local_20.y;
  local_28.y = local_20.y + 1;
  local_20 = coords;
  if ((((-1 < (int)(local_28.y | uVar5)) && (uVar5 < gamefield->width)) &&
      ((uint)local_28.y < gamefield->height)) &&
     (local_28.x = uVar5, _Var2 = CheckDensity(gamefield,&local_20,&local_28), _Var2)) {
    return;
  }
  local_28.y = iVar1 - 1;
  if ((((int)(local_28.y | uVar5) < 0) || (gamefield->width <= uVar5)) ||
     ((gamefield->height <= (uint)local_28.y ||
      (local_28.x = uVar5,
      gamefield->pixels[gamefield->width * local_28.y + uVar5].pixelType != Empty)))) {
    uVar3 = uVar5 - 1;
    if (-1 < (int)(local_28.y | uVar3)) {
      if ((uVar3 < gamefield->width) && ((uint)local_28.y < gamefield->height)) {
        iVar4 = gamefield->width * local_28.y;
        if ((gamefield->pixels[iVar4 + uVar3].pixelType == Empty) &&
           (((local_28.x = uVar5 + 1,
             (uint)local_28.x < gamefield->width && -1 < (local_28.y | local_28.x) &&
             ((uint)local_28.y < gamefield->height)) &&
            (gamefield->pixels[(uint)(iVar4 + local_28.x)].pixelType == Empty)))) {
          if ((gamefield->simulationStep & 1) == 0) {
            local_28.x = uVar3;
          }
          goto LAB_00140216;
        }
      }
      if (((-1 < (int)(local_28.y | uVar3)) && (uVar3 < gamefield->width)) &&
         (((uint)local_28.y < gamefield->height &&
          (local_28.x = uVar3,
          gamefield->pixels[gamefield->width * local_28.y + uVar3].pixelType == Empty))))
      goto LAB_00140216;
    }
    local_28.x = uVar5 + 1;
    if ((((local_28.y | local_28.x) < 0) || (gamefield->width <= (uint)local_28.x)) ||
       ((gamefield->height <= (uint)local_28.y ||
        (gamefield->pixels[gamefield->width * local_28.y + local_28.x].pixelType != Empty)))) {
      if (-1 < (int)(iVar1 | uVar3)) {
        if ((uVar3 < gamefield->width) && ((uint)iVar1 < gamefield->height)) {
          iVar4 = gamefield->width * iVar1;
          if ((gamefield->pixels[iVar4 + uVar3].pixelType == Empty) &&
             ((((uint)local_28.x < gamefield->width && -1 < (iVar1 | local_28.x) &&
               ((uint)iVar1 < gamefield->height)) &&
              (gamefield->pixels[(uint)(iVar4 + local_28.x)].pixelType == Empty)))) {
            local_28.y = iVar1;
            if ((gamefield->simulationStep & 1) == 0) {
              local_28.x = uVar3;
            }
            goto LAB_00140216;
          }
        }
        if (((-1 < (int)(iVar1 | uVar3)) && (uVar3 < gamefield->width)) &&
           (((uint)iVar1 < gamefield->height &&
            (gamefield->pixels[gamefield->width * iVar1 + uVar3].pixelType == Empty)))) {
          local_28.y = iVar1;
          local_28.x = uVar3;
          goto LAB_00140216;
        }
      }
      if ((iVar1 | local_28.x) < 0) {
        return;
      }
      if (gamefield->width <= (uint)local_28.x) {
        return;
      }
      if (gamefield->height <= (uint)iVar1) {
        return;
      }
      if (gamefield->pixels[gamefield->width * iVar1 + local_28.x].pixelType != Empty) {
        return;
      }
      local_28.y = iVar1;
    }
  }
LAB_00140216:
  SwapWaterPixel(gamefield,&local_20,&local_28);
  return;
}

Assistant:

void WaterStep(Gamefield* gamefield, IntVec2 coords) {
    struct IntVec2 new;
    new.x = coords.x;
    new.y = coords.y + 1;

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && CheckDensity(gamefield, &coords, &new)) {
        return;
    }

    if (WithinBounds(gamefield, coords.x, coords.y - 1) && gamefield->pixels[(coords.y - 1) * gamefield->width + coords.x].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.y -= 1;
            new.x -= 1;
        } else {
            new.y -= 1;
            new.x += 1;
        }
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x += 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.x -= 1;
        } else {
            new.x += 1;
        }
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x += 1;
        SwapWaterPixel(gamefield, &coords, &new);
    }
}